

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O2

void Csw_ManStop(Csw_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int level;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  if (p->fVerbose != 0) {
    uVar3 = p->pManAig->nObjs[6] + p->pManAig->nObjs[5];
    uVar4 = p->pManRes->nObjs[6] + p->pManRes->nObjs[5];
    uVar1 = p->nNodesTried;
    uVar2 = Csw_TableCountCuts(p);
    printf("Beg = %7d.  End = %7d.  (%6.2f %%)  Try = %7d.  Cuts = %8d.\n",
           ((double)(int)(uVar3 - uVar4) * 100.0) / (double)(int)uVar3,(ulong)uVar3,(ulong)uVar4,
           (ulong)uVar1,(ulong)uVar2);
    level = 0x7fdf03;
    printf("Triv0 = %6d.  Triv1 = %6d.  Triv2 = %6d.  Cut-replace = %6d.\n",
           (ulong)(uint)p->nNodesTriv0,(ulong)(uint)p->nNodesTriv1,(ulong)(uint)p->nNodesTriv2,
           (ulong)(uint)p->nNodesCuts);
    Abc_Print(level,"%s =","Cuts    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeCuts * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCuts / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Hashing ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeHash * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeHash / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Other   ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(level,"%s =","TOTAL   ");
    dVar5 = (double)p->timeTotal;
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = (dVar5 * 100.0) / dVar5;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar5 / 1000000.0,dVar6);
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  Aig_MmFixedStop(p->pMemCuts,0);
  if (p->pnRefs != (int *)0x0) {
    free(p->pnRefs);
    p->pnRefs = (int *)0x0;
  }
  if (p->pEquiv != (Aig_Obj_t **)0x0) {
    free(p->pEquiv);
    p->pEquiv = (Aig_Obj_t **)0x0;
  }
  if (p->pCuts != (Csw_Cut_t **)0x0) {
    free(p->pCuts);
    p->pCuts = (Csw_Cut_t **)0x0;
  }
  free(p->pTable);
  free(p);
  return;
}

Assistant:

void Csw_ManStop( Csw_Man_t * p )
{
    if ( p->fVerbose )
    {
        int nNodesBeg = Aig_ManNodeNum(p->pManAig);
        int nNodesEnd = Aig_ManNodeNum(p->pManRes);
        printf( "Beg = %7d.  End = %7d.  (%6.2f %%)  Try = %7d.  Cuts = %8d.\n", 
            nNodesBeg, nNodesEnd, 100.0*(nNodesBeg-nNodesEnd)/nNodesBeg,
            p->nNodesTried, Csw_TableCountCuts( p ) );
        printf( "Triv0 = %6d.  Triv1 = %6d.  Triv2 = %6d.  Cut-replace = %6d.\n", 
            p->nNodesTriv0, p->nNodesTriv1, p->nNodesTriv2, p->nNodesCuts );
        ABC_PRTP( "Cuts    ", p->timeCuts,     p->timeTotal );
        ABC_PRTP( "Hashing ", p->timeHash,     p->timeTotal );
        ABC_PRTP( "Other   ", p->timeOther,    p->timeTotal );
        ABC_PRTP( "TOTAL   ", p->timeTotal,    p->timeTotal );
    }
    ABC_FREE( p->puTemp[0] );
    Aig_MmFixedStop( p->pMemCuts, 0 );
    ABC_FREE( p->pnRefs );
    ABC_FREE( p->pEquiv );
    ABC_FREE( p->pCuts );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}